

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.cpp
# Opt level: O2

bool __thiscall
test_quickhull<double,_std::forward_list<double,_std::allocator<double>_>,_std::forward_list<std::forward_list<double,_std::allocator<double>_>,_std::allocator<std::forward_list<double,_std::allocator<double>_>_>_>_>
::gnuplot::output(gnuplot *this,ostream *_out)

{
  point_list *ppVar1;
  ulong uVar2;
  size_type sVar3;
  _Elt_pointer pfVar4;
  pointer p_Var5;
  _Elt_pointer p_Var6;
  ostream *poVar7;
  _Elt_pointer pfVar8;
  _Map_pointer ppfVar9;
  long *plVar10;
  _Fwd_list_node_base *p_Var11;
  char *pcVar12;
  _List_node_base *p_Var13;
  const_iterator __end0;
  _Elt_pointer p_Var14;
  facet *facet_;
  _Elt_pointer pfVar15;
  pointer p_Var16;
  _Elt_pointer p_Var17;
  _Map_pointer local_68;
  _Elt_pointer local_58;
  _Map_pointer local_50;
  
  uVar2 = (this->quick_hull_).dimension_;
  if (3 < uVar2) {
    poVar7 = std::operator<<(this->log_,"dimensionality value ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," is out of supported range: cannot generate output");
    std::endl<char,std::char_traits<char>>(poVar7);
    goto LAB_0011655f;
  }
  if (this->f == true) {
    this->f = false;
    pcVar12 = 
    "set view equal xyz\nset autoscale\nset key left\nset xrange [] writeback\nset yrange [] writeback\nset zrange [] writeback\n"
    ;
  }
  else {
    pcVar12 = "pause mouse\n\nclear\nset xrange restore\nset yrange restore\nset zrange restore\n";
  }
  std::operator<<(_out,pcVar12);
  poVar7 = std::operator<<(_out,"set title \'Points count is ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"\'\n");
  sVar3 = (this->quick_hull_).dimension_;
  if (sVar3 == 2) {
    pcVar12 = "plot";
LAB_001165d3:
    std::operator<<(_out,pcVar12);
  }
  else if (sVar3 == 3) {
    pcVar12 = "splot";
    goto LAB_001165d3;
  }
  ppVar1 = &this->universe_;
  std::operator<<(_out,
                  " \'-\' with points notitle pointtype 4 pointsize 1.5 linetype 1, \'-\' with points notitle, \'-\' with labels offset character 0, character 1 notitle"
                 );
  pfVar15 = (this->quick_hull_).facets_.
            super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pfVar8 = (this->quick_hull_).facets_.
           super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_68 = (this->quick_hull_).facets_.
             super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pfVar4 = (this->quick_hull_).facets_.
           super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pfVar15 != pfVar4) {
    std::operator<<(_out,", \'-\' with lines notitle");
    if ((pfVar15->coplanar_).
        super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (pfVar15->coplanar_).
        super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::operator<<(_out,", \'-\' with points notitle pointtype 6 pointsize 1.5 linetype 4");
    }
    pfVar15 = pfVar15 + 1;
    if (pfVar15 == pfVar8) {
      pfVar15 = local_68[1];
      local_68 = local_68 + 1;
      pfVar8 = pfVar15 + 2;
    }
  }
  std::operator<<(_out,";\n");
  p_Var13 = (_List_node_base *)&this->initial_simplex_;
  while (p_Var13 = (((_List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                      *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var13 != (_List_node_base *)&this->initial_simplex_) {
    plVar10 = (long *)((long)p_Var13[1]._M_next + 8);
    while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
      poVar7 = std::ostream::_M_insert<double>((double)plVar10[1]);
      std::operator<<(poVar7,' ');
    }
    std::operator<<(_out,'\n');
  }
  std::operator<<(_out,"e\n");
  p_Var13 = (_List_node_base *)ppVar1;
  while (p_Var13 = (((_List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                      *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var13 != (_List_node_base *)ppVar1) {
    plVar10 = (long *)((long)p_Var13[1]._M_next + 8);
    while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
      poVar7 = std::ostream::_M_insert<double>((double)plVar10[1]);
      std::operator<<(poVar7,' ');
    }
    std::operator<<(_out,'\n');
  }
  std::operator<<(_out,"e\n");
  p_Var13 = (_List_node_base *)ppVar1;
  while (p_Var13 = (((_List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                      *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var13 != (_List_node_base *)ppVar1) {
    plVar10 = (long *)((long)p_Var13[1]._M_next + 8);
    while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
      poVar7 = std::ostream::_M_insert<double>((double)plVar10[1]);
      std::operator<<(poVar7,' ');
    }
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)_out);
    std::operator<<(poVar7,'\n');
  }
  std::operator<<(_out,"e\n");
  pfVar8 = (this->quick_hull_).facets_.
           super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58 = (this->quick_hull_).facets_.
             super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppfVar9 = (this->quick_hull_).facets_.
            super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pfVar15 = (this->quick_hull_).facets_.
            super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pfVar8 != pfVar15) {
    p_Var5 = (pfVar8->vertices_).
             super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var16 = (pfVar8->vertices_).
                   super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; p_Var16 != p_Var5;
        p_Var16 = p_Var16 + 1) {
      p_Var11 = p_Var16->_M_node + 1;
      while (p_Var11 = p_Var11->_M_next, p_Var11 != (_Fwd_list_node_base *)0x0) {
        poVar7 = std::ostream::_M_insert<double>((double)p_Var11[1]._M_next);
        std::operator<<(poVar7,' ');
      }
      std::operator<<(_out,'\n');
    }
    p_Var11 = ((pfVar8->vertices_).
               super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_node + 1;
    while (p_Var11 = p_Var11->_M_next, p_Var11 != (_Fwd_list_node_base *)0x0) {
      poVar7 = std::ostream::_M_insert<double>((double)p_Var11[1]._M_next);
      std::operator<<(poVar7,' ');
    }
    std::operator<<(_out,"\ne\n");
    p_Var17 = (pfVar8->coplanar_).
              super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    p_Var6 = (pfVar8->coplanar_).
             super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (p_Var6 != p_Var17) {
      p_Var14 = (pfVar8->coplanar_).
                super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_50 = (pfVar8->coplanar_).
                 super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      while (p_Var17 != p_Var6) {
        p_Var11 = p_Var17->_M_node + 1;
        while (p_Var11 = p_Var11->_M_next, p_Var11 != (_Fwd_list_node_base *)0x0) {
          poVar7 = std::ostream::_M_insert<double>((double)p_Var11[1]._M_next);
          std::operator<<(poVar7,' ');
        }
        std::operator<<(_out,'\n');
        p_Var17 = p_Var17 + 1;
        if (p_Var17 == p_Var14) {
          p_Var17 = local_50[1];
          local_50 = local_50 + 1;
          p_Var14 = p_Var17 + 0x40;
        }
      }
      std::operator<<(_out,"e\n");
    }
    pfVar8 = pfVar8 + 1;
    if (pfVar8 == local_58) {
      pfVar8 = ppfVar9[1];
      ppfVar9 = ppfVar9 + 1;
      local_58 = pfVar8 + 2;
    }
  }
LAB_0011655f:
  return uVar2 < 4;
}

Assistant:

bool
        output(std::ostream & _out) const
        {
            if (operator bool ()) {
                log_ << "dimensionality value " << quick_hull_.dimension_
                     << " is out of supported range: cannot generate output" << std::endl;
                return false;
            }
            if (f) {
                f = false;
                _out << "set view equal xyz\n"
                        "set autoscale\n"
                        "set key left\n"
                        "set xrange [] writeback\n"
                        "set yrange [] writeback\n"
                        "set zrange [] writeback\n";
            } else {
                _out << "pause mouse\n\n"
                        "clear\n"
                        "set xrange restore\n"
                        "set yrange restore\n"
                        "set zrange restore\n";
            }